

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O1

void * __thiscall ON_FixedSizePool::AllocateDirtyElement(ON_FixedSizePool *this)

{
  long *plVar1;
  ulong uVar2;
  undefined8 *puVar3;
  void *pvVar4;
  ON_FixedSizePool *pOVar5;
  int line_number;
  
  puVar3 = (undefined8 *)this->m_al_element_stack;
  if (puVar3 == (undefined8 *)0x0) {
    plVar1 = (long *)this->m_al_block;
    if (this->m_al_count == 0 || plVar1 == (long *)0x0) {
      if (plVar1 == (long *)0x0) {
        pvVar4 = (void *)0x0;
      }
      else {
        pvVar4 = (void *)*plVar1;
      }
      if (pvVar4 == (void *)0x0) {
        if (this->m_sizeof_element == 0) {
          line_number = 0x15c;
LAB_00491331:
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_fsp.cpp"
                     ,line_number,"",
                     "ON_FixedSizePool::AllocateElement - you must call ON_FixedSizePool::Create with a valid element size before using ON_FixedSizePool"
                    );
          return (void *)0x0;
        }
        if (this->m_al_count == 0) {
          this->m_al_count = this->m_block_element_count;
        }
        if (this->m_al_count == 0) {
          line_number = 0x165;
          goto LAB_00491331;
        }
        puVar3 = (undefined8 *)onmalloc(this->m_al_count * this->m_sizeof_element + 0x10);
        *puVar3 = 0;
        puVar3[1] = (long)puVar3 + this->m_sizeof_element * this->m_al_count + 0x10;
        pOVar5 = this;
        if (this->m_first_block != (void *)0x0) {
          pOVar5 = (ON_FixedSizePool *)this->m_al_block;
        }
        pOVar5->m_first_block = puVar3;
        this->m_al_block = puVar3;
      }
      else {
        this->m_al_block = pvVar4;
        if (this->m_sizeof_element == 0) {
          uVar2 = 0;
        }
        else {
          uVar2 = ((*(long *)((long)pvVar4 + 8) - (long)pvVar4) - 0x10U) / this->m_sizeof_element;
        }
        this->m_al_count = uVar2;
      }
      this->m_al_element_array = (void *)((long)this->m_al_block + 0x10);
    }
    this->m_al_count = this->m_al_count - 1;
    puVar3 = (undefined8 *)this->m_al_element_array;
    this->m_al_element_array = (void *)(this->m_sizeof_element + (long)puVar3);
    this->m_total_element_count = this->m_total_element_count + 1;
  }
  else {
    this->m_al_element_stack = (void *)*puVar3;
  }
  this->m_active_element_count = this->m_active_element_count + 1;
  return puVar3;
}

Assistant:

void* ON_FixedSizePool::AllocateDirtyElement()
{
  void* p;

  if ( 0 != m_al_element_stack )
  {
    // use item on the returned stack first.
    p = m_al_element_stack;
    m_al_element_stack = *((void**)m_al_element_stack);
  }
  else
  {
    if ( 0 == m_al_block || 0 == m_al_count )
    {
      // No more memory left in m_al_block.
      void* next_block = (0 != m_al_block)
                       ? *((void**)m_al_block)
                       : 0;
      if ( 0 == next_block )
      {
        // This if clause is used when we need to allocate a new block from the heap
        if ( 0 == m_sizeof_element )
        {
          ON_ERROR("ON_FixedSizePool::AllocateElement - you must call ON_FixedSizePool::Create with a valid element size before using ON_FixedSizePool");
          return nullptr;
        }
        // allocate a new block
        if ( 0 == m_al_count )
          m_al_count = m_block_element_count;

        if ( m_al_count <= 0 )
        {
          ON_ERROR("ON_FixedSizePool::AllocateElement - you must call ON_FixedSizePool::Create with a valid element size before using ON_FixedSizePool");
          return nullptr;
        }

        p = onmalloc( 2*sizeof(void*) + m_al_count*m_sizeof_element ); // get some heap

        // set "next" pointer to zero
        *((void**)p) = nullptr;

        // set "end" pointer to address after last byte in the block
        *((void**)(((char*)p) + sizeof(void*))) = ((char*)p) + (2*sizeof(void*) + m_al_count*m_sizeof_element);
        if ( 0 == m_first_block )
        {
          m_first_block = p;
          // If the call to Create() specified a positive element_count_estimate,
          // then m_sizeof_block needs to be reset for any future block allocations.

        }
        else
        {
          // If m_first_block != 0, then m_al_block is nonzero (or memory for this class has been trashed)
          *((void**)m_al_block) = p;
        }
        m_al_block = p;
      }
      else
      {
        // If we get here, ReturnAll() was used at some point in
        // the past, m_al_block != 0, m_al_count = zero, and we are
        // reusing blocks that were allocated early.
        m_al_block = next_block;
        m_al_count = BlockElementCapacity(m_al_block);
      }

      m_al_element_array = (void*)(((char*)m_al_block)+2*sizeof(void*));
    }
    m_al_count--;
    p = m_al_element_array;
    m_al_element_array = (void*)(((char*)m_al_element_array) + m_sizeof_element);
    m_total_element_count++;
  }

  m_active_element_count++;

  return p;
}